

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O0

void PrintGameMenu(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_8fc);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(selectionLevel[0] & 1));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_913);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(selectionLevel[1] & 1));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_929);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(selectionLevel[2] & 1));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_933);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(selectionLevel[3] & 1));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_93d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(selectionLevel[4] & 1));
  std::operator<<(poVar1,anon_var_dwarf_947);
  return;
}

Assistant:

void PrintGameMenu()
{
    cout << "╔═════════════════════════════════════════════════════════════════"
            "═══════════════════════════════════════╗\n"
            "║•••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••"
            "•••••••••••••••••••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╔═════════════════════════════════════════"
            "═══════════════╗•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••║              Прогресс Прохождения "
            "Уровней              ║•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╟─────────────────────────────────────────"
            "───────────────╢•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••║              0 - не пройдено 1 - "
            "пройдено              ║•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╚═════════════════════════════════════════"
            "═══════════════╝•••••••••••••••••••••••║\n"
            "║••••••••••••╔═══════════════╤═══════════════╤═══════════════╤════"
            "═══════════╤═══════════════╗•••••••••••║\n"
            "║••••••••••••║               │               │               │    "
            "           │               ║•••••••••••║\n"
            "║••••••••••••║ Уровень 1 - "
         << selectionLevel[0] << " │ Уровень 2 - " << selectionLevel[1]
         << " │ Уровень 3 - " << selectionLevel[2] << " │ Уровень 4 - "
         << selectionLevel[3] << " │ Уровень 5 - " << selectionLevel[4]
         << " ║•••••••••••║\n"
            "║••••••••••••║               │               │               │    "
            "           │               ║•••••••••••║\n"
            "║••••••••••••╚═══════════════╧═══════════════╧═══════════════╧════"
            "═══════════╧═══════════════╝•••••••••••║\n"
            "║•••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••"
            "•••••••••••••••••••••••••••••••••••••••║\n"
            "╚═════════════════════════════════════════════════════════════════"
            "═══════════════════════════════════════╝\n";
}